

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeEntryPointData.cpp
# Opt level: O0

void __thiscall
InProcNativeEntryPointData::SetSortedLazyBailOutRecordList
          (InProcNativeEntryPointData *this,
          List<LazyBailOutRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *sortedLazyBailOutRecordList)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  JITManager *this_00;
  undefined4 *puVar4;
  HeapAllocator *alloc;
  List<LazyBailOutRecord,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_01;
  TrackAllocData local_48;
  List<LazyBailOutRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *local_20;
  List<LazyBailOutRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *local_18;
  List<LazyBailOutRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *sortedLazyBailOutRecordList_local;
  InProcNativeEntryPointData *this_local;
  
  local_18 = sortedLazyBailOutRecordList;
  sortedLazyBailOutRecordList_local =
       (List<LazyBailOutRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)this;
  this_00 = JITManager::GetJITManager();
  bVar2 = JITManager::IsOOPJITEnabled(this_00);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeEntryPointData.cpp"
                       ,0x1ba,"(!JITManager::GetJITManager()->IsOOPJITEnabled())",
                       "!JITManager::GetJITManager()->IsOOPJITEnabled()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (this->sortedLazyBailoutRecordList != (Type)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeEntryPointData.cpp"
                       ,0x1bb,"(this->sortedLazyBailoutRecordList == nullptr)",
                       "this->sortedLazyBailoutRecordList == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (local_18 ==
      (List<LazyBailOutRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeEntryPointData.cpp"
                       ,0x1c1,"(sortedLazyBailOutRecordList != nullptr)",
                       "sortedLazyBailOutRecordList != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  iVar3 = JsUtil::ReadOnlyList<LazyBailOutRecord,_Memory::ArenaAllocator,_DefaultComparer>::Count
                    (&local_18->
                      super_ReadOnlyList<LazyBailOutRecord,_Memory::ArenaAllocator,_DefaultComparer>
                    );
  if (1 < iVar3) {
    local_20 = local_18;
    JsUtil::
    List<LazyBailOutRecord,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>::
    MapFrom<InProcNativeEntryPointData::SetSortedLazyBailOutRecordList(JsUtil::List<LazyBailOutRecord,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>*)::__0>
              ((List<LazyBailOutRecord,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
                *)local_18,1,(anon_class_8_1_2da7348a)local_18);
  }
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,
             (type_info *)
             &JsUtil::
              List<LazyBailOutRecord,Memory::HeapAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
              ::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeEntryPointData.cpp"
             ,0x1d0);
  alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_48);
  this_01 = (List<LazyBailOutRecord,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)new<Memory::HeapAllocator>(0x30,alloc,0x350bd0);
  JsUtil::
  List<LazyBailOutRecord,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::List
            (this_01,&Memory::HeapAllocator::Instance,4);
  this->sortedLazyBailoutRecordList = this_01;
  JsUtil::List<LazyBailOutRecord,Memory::HeapAllocator,false,Js::CopyRemovePolicy,DefaultComparer>::
  Copy<JsUtil::List<LazyBailOutRecord,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>>
            ((List<LazyBailOutRecord,Memory::HeapAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
              *)this->sortedLazyBailoutRecordList,local_18);
  return;
}

Assistant:

void 
InProcNativeEntryPointData::SetSortedLazyBailOutRecordList(JsUtil::List<LazyBailOutRecord, ArenaAllocator> *sortedLazyBailOutRecordList)
{
    Assert(!JITManager::GetJITManager()->IsOOPJITEnabled());
    Assert(this->sortedLazyBailoutRecordList == nullptr);

#if DBG

    // Making sure the list is sorted

    Assert(sortedLazyBailOutRecordList != nullptr);
    if (sortedLazyBailOutRecordList->Count() >= 2)
    {
        sortedLazyBailOutRecordList->MapFrom(1, [=](int index, const LazyBailOutRecord& currentRecord)
        {
            const LazyBailOutRecord& previousRecord = sortedLazyBailOutRecordList->Item(index - 1);
            AssertMsg(
                currentRecord.offset > previousRecord.offset,
                "Lazy bailout record list isn't sorted by offset?"
            );
        });
    }

#endif

    this->sortedLazyBailoutRecordList = HeapNew(NativeLazyBailOutRecordList, &HeapAllocator::Instance);
    this->sortedLazyBailoutRecordList->Copy(sortedLazyBailOutRecordList);
}